

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_pool2d::build_graph(test_pool2d *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  int64_t *in_RSI;
  ggml_context *in_RDI;
  ggml_tensor *out;
  ggml_tensor *input;
  int64_t *ne;
  int in_stack_ffffffffffffffd0;
  ggml_type type;
  test_case *in_stack_ffffffffffffffe0;
  
  type = *(ggml_type *)(in_RDI + 0x3c);
  ne = in_RSI;
  std::array<long,_4UL>::data((array<long,_4UL> *)0x146dc2);
  pgVar1 = test_case::ggml_new_tensor
                     (in_stack_ffffffffffffffe0,in_RDI,type,in_stack_ffffffffffffffd0,ne);
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"input");
  pgVar1 = (ggml_tensor *)
           ggml_pool_2d((float)*(int *)(in_RDI + 0x70),(float)*(int *)(in_RDI + 0x74),in_RSI,pgVar1,
                        *(undefined4 *)(in_RDI + 0x38),*(undefined4 *)(in_RDI + 0x60),
                        *(undefined4 *)(in_RDI + 100),*(undefined4 *)(in_RDI + 0x68),
                        *(undefined4 *)(in_RDI + 0x6c));
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, type_input, 4, ne_input.data());
        ggml_set_param(ctx, input);
        ggml_set_name(input, "input");

        ggml_tensor * out = ggml_pool_2d(ctx, input, pool_type, k0, k1, s0, s1, p0, p1);
        ggml_set_name(out, "out");

        return out;
    }